

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O0

void changeLpCosts(HighsLp *lp,HighsIndexCollection *index_collection,
                  vector<double,_std::allocator<double>_> *new_col_cost,double infinite_cost)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  const_reference pvVar4;
  const_reference pvVar5;
  reference pvVar6;
  vector<double,_std::allocator<double>_> *in_RDX;
  HighsIndexCollection *in_RSI;
  long in_RDI;
  HighsInt col;
  HighsInt k;
  HighsInt usr_col;
  HighsInt lp_col;
  vector<int,_std::allocator<int>_> *col_mask;
  vector<int,_std::allocator<int>_> *col_set;
  bool *mask;
  bool *interval;
  HighsInt to_k;
  HighsInt from_k;
  value_type in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa8;
  int local_50;
  int local_4c;
  int local_28;
  int local_24 [3];
  vector<double,_std::allocator<double>_> *local_18;
  HighsIndexCollection *local_10;
  long local_8;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  limits(in_RSI,local_24,&local_28);
  if (local_24[0] <= local_28) {
    local_50 = -1;
    for (iVar3 = local_24[0]; iVar3 < local_28 + 1; iVar3 = iVar3 + 1) {
      local_4c = iVar3;
      if (((local_10->is_interval_ & 1U) == 0) && ((local_10->is_mask_ & 1U) == 0)) {
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_10->set_,(long)iVar3);
        local_4c = *pvVar4;
      }
      iVar1 = iVar3;
      if ((local_10->is_interval_ & 1U) != 0) {
        iVar1 = local_50 + 1;
      }
      local_50 = iVar1;
      if (((local_10->is_mask_ & 1U) == 0) ||
         (pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&local_10->mask_,(long)local_4c), *pvVar4 != 0)) {
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](local_18,(long)local_50);
        in_stack_ffffffffffffffa0 = *pvVar5;
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(local_8 + 8),(long)local_4c)
        ;
        *pvVar6 = in_stack_ffffffffffffffa0;
      }
      in_stack_ffffffffffffffa8 = local_4c;
    }
    if ((*(byte *)(local_8 + 600) & 1) != 0) {
      bVar2 = HighsLp::hasInfiniteCost
                        ((HighsLp *)CONCAT44(iVar3,in_stack_ffffffffffffffa8),
                         in_stack_ffffffffffffffa0);
      *(bool *)(local_8 + 600) = bVar2;
    }
  }
  return;
}

Assistant:

void changeLpCosts(HighsLp& lp, const HighsIndexCollection& index_collection,
                   const vector<double>& new_col_cost,
                   const double infinite_cost) {
  assert(ok(index_collection));
  HighsInt from_k;
  HighsInt to_k;
  limits(index_collection, from_k, to_k);
  if (from_k > to_k) return;

  const bool& interval = index_collection.is_interval_;
  const bool& mask = index_collection.is_mask_;
  const vector<HighsInt>& col_set = index_collection.set_;
  const vector<HighsInt>& col_mask = index_collection.mask_;

  // Change the costs to the user-supplied costs, according to the technique
  HighsInt lp_col;
  HighsInt usr_col = -1;
  for (HighsInt k = from_k; k < to_k + 1; k++) {
    if (interval || mask) {
      lp_col = k;
    } else {
      lp_col = col_set[k];
    }
    HighsInt col = lp_col;
    if (interval) {
      usr_col++;
    } else {
      usr_col = k;
    }
    if (mask && !col_mask[col]) continue;
    lp.col_cost_[col] = new_col_cost[usr_col];
  }
  // Check whether the LP still has an infinite cost
  if (lp.has_infinite_cost_)
    lp.has_infinite_cost_ = lp.hasInfiniteCost(infinite_cost);
}